

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueSetCase::postTest
          (SampleMaskUniqueSetCase *this)

{
  deUint32 dVar1;
  bool bVar2;
  int width_00;
  int height_00;
  int iVar3;
  reference pvVar4;
  TestLog *pTVar5;
  size_type sVar6;
  reference pvVar7;
  MessageBuilder *pMVar8;
  uint *puVar9;
  size_type sVar10;
  reference puVar11;
  float fVar12;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar13;
  bool local_12f4;
  bool local_12f2;
  int local_11ec;
  MessageBuilder local_11e8;
  Hex<8UL> local_1068;
  MessageBuilder local_1060;
  _Self local_ee0;
  _Self local_ed8;
  iterator it;
  MessageBuilder local_ec8;
  _Base_ptr local_d48;
  undefined1 local_d40;
  PixelBufferAccess local_d38;
  undefined1 local_d10 [24];
  deUint32 mask_1;
  int maskNdx;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> masks;
  int x_3;
  int y_3;
  undefined4 local_b3c;
  int local_b38;
  int printFloodLimit_2;
  int printCount_2;
  int iStack_b2c;
  bool countOk;
  deUint32 minNumInvocations;
  Hex<8UL> local_9a8;
  Hex<8UL> local_9a0;
  MessageBuilder local_998;
  PixelBufferAccess local_818;
  undefined1 local_7ec [24];
  deUint32 maskB;
  undefined1 local_7b0 [24];
  deUint32 maskA;
  int sampleNdxB;
  int sampleNdxA;
  int iStack_78c;
  bool maskBitsNotUnique;
  int x_2;
  int y_2;
  undefined4 local_608;
  int local_604;
  int printFloodLimit_1;
  int printCount_1;
  undefined1 local_5f8 [3];
  bool uniquenessOk;
  Hex<8UL> local_478;
  Hex<8UL> local_470;
  MessageBuilder local_468;
  PixelBufferAccess local_2e8;
  undefined1 local_2bc [24];
  deUint32 mask;
  int x_1;
  int y_1;
  int local_120;
  undefined4 local_11c;
  int printCount;
  int printFloodLimit;
  PixelBufferAccess local_108;
  int local_dc;
  int local_d8;
  int blueBits_1;
  int greenBits_1;
  int redBits_1;
  int blueBits;
  int greenBits;
  int redBits;
  deUint16 high;
  deUint16 low;
  RGBA highColor;
  RGBA lowColor;
  int x;
  int y;
  int local_a8;
  allocator<char> local_a1;
  int sampleNdx;
  allocator<char> local_79;
  string local_78;
  ScopedLogSection local_58;
  ScopedLogSection section;
  allocator<tcu::TextureLevel> local_39;
  undefined1 local_38 [8];
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> sampleCoverage;
  bool allOk;
  int height;
  int width;
  SampleMaskUniqueSetCase *this_local;
  
  pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                     (&this->m_iterationSampleBuffers,0);
  width_00 = tcu::Surface::getWidth(pvVar4);
  pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                     (&this->m_iterationSampleBuffers,0);
  height_00 = tcu::Surface::getHeight(pvVar4);
  sampleCoverage.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  iVar3 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          m_numTargetSamples;
  std::allocator<tcu::TextureLevel>::allocator(&local_39);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_38,(long)iVar3,
             &local_39);
  std::allocator<tcu::TextureLevel>::~allocator(&local_39);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Verify",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&sampleNdx,"Verify masks",&local_a1);
  tcu::ScopedLogSection::ScopedLogSection(&local_58,pTVar5,&local_78,(string *)&sampleNdx);
  std::__cxx11::string::~string((string *)&sampleNdx);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  for (local_a8 = 0; iVar3 = local_a8,
      sVar6 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::size
                        ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_38),
      iVar3 < (int)sVar6; local_a8 = local_a8 + 1) {
    pvVar7 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                       ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_38,
                        (long)local_a8);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&x,R,UNSIGNED_INT32);
    tcu::TextureLevel::setStorage(pvVar7,(TextureFormat *)&x,width_00,height_00,1);
    for (lowColor.m_value = 0; (int)lowColor.m_value < height_00;
        lowColor.m_value = lowColor.m_value + 1) {
      for (highColor.m_value = 0; (int)highColor.m_value < width_00;
          highColor.m_value = highColor.m_value + 1) {
        pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                           (&this->m_iterationSampleBuffers,(long)local_a8);
        _high = tcu::Surface::getPixel(pvVar4,highColor.m_value,lowColor.m_value);
        iVar3 = local_a8;
        sVar6 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::size
                          ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_38
                          );
        pvVar4 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                           (&this->m_iterationSampleBuffers,(long)(iVar3 + (int)sVar6));
        redBits = (int)tcu::Surface::getPixel(pvVar4,highColor.m_value,lowColor.m_value);
        iVar3 = tcu::RGBA::getRed((RGBA *)&high);
        fVar12 = deFloatRound(((float)iVar3 / 255.0) * 31.0);
        blueBits = (int)fVar12;
        iVar3 = tcu::RGBA::getGreen((RGBA *)&high);
        fVar12 = deFloatRound(((float)iVar3 / 255.0) * 63.0);
        redBits_1 = (int)fVar12;
        iVar3 = tcu::RGBA::getBlue((RGBA *)&high);
        fVar12 = deFloatRound(((float)iVar3 / 255.0) * 31.0);
        greenBits_1 = (int)fVar12;
        greenBits._2_2_ = (ushort)blueBits | (ushort)(redBits_1 << 5) | (ushort)(greenBits_1 << 0xb)
        ;
        iVar3 = tcu::RGBA::getRed((RGBA *)&redBits);
        fVar12 = deFloatRound(((float)iVar3 / 255.0) * 31.0);
        blueBits_1 = (int)fVar12;
        iVar3 = tcu::RGBA::getGreen((RGBA *)&redBits);
        fVar12 = deFloatRound(((float)iVar3 / 255.0) * 63.0);
        local_d8 = (int)fVar12;
        iVar3 = tcu::RGBA::getBlue((RGBA *)&redBits);
        fVar12 = deFloatRound(((float)iVar3 / 255.0) * 31.0);
        local_dc = (int)fVar12;
        greenBits._0_2_ = (ushort)blueBits_1 | (ushort)(local_d8 << 5) | (ushort)(local_dc << 0xb);
        pvVar7 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                           ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                            local_38,(long)local_a8);
        tcu::TextureLevel::getAccess(&local_108,pvVar7);
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)&printCount,
                   CONCAT22((ushort)greenBits,greenBits._2_2_),0,0,0);
        tcu::PixelBufferAccess::setPixel
                  (&local_108,(UVec4 *)&printCount,highColor.m_value,lowColor.m_value,0);
      }
    }
  }
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples == 0) {
    local_11c = 5;
    local_120 = 0;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&x_1,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&x_1,(char (*) [37])"Verifying sample mask is 0x00000001."
                       );
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x_1);
    for (mask = 0; (int)mask < height_00; mask = mask + 1) {
      for (local_2bc._20_4_ = 0; (int)local_2bc._20_4_ < width_00;
          local_2bc._20_4_ = local_2bc._20_4_ + 1) {
        pvVar7 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                           ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                            local_38,0);
        tcu::TextureLevel::getAccess(&local_2e8,pvVar7);
        tcu::ConstPixelBufferAccess::getPixelUint
                  ((ConstPixelBufferAccess *)local_2bc,(int)&local_2e8,local_2bc._20_4_,mask);
        puVar9 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_2bc);
        local_2bc._16_4_ = *puVar9;
        if (local_2bc._16_4_ != 1) {
          sampleCoverage.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          local_120 = local_120 + 1;
          if (local_120 < 6) {
            pTVar5 = tcu::TestContext::getLog
                               ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                super_MultisampleRenderCase.super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_468,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<(&local_468,(char (*) [8])"Pixel (");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)(local_2bc + 0x14));
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&mask);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [22])"): Invalid mask, got ");
            tcu::Format::Hex<8UL>::Hex(&local_470,(ulong)(uint)local_2bc._16_4_);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_470);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])0x2c24a65);
            tcu::Format::Hex<8UL>::Hex(&local_478,1);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_478);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_468);
          }
        }
      }
    }
    if (((sampleCoverage.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) && (5 < local_120)) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_5f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_5f8,(char (*) [5])0x2b66789);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])"Omitted ");
      printCount_1 = local_120 + -5;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&printCount_1);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2c3fe31);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_5f8);
    }
  }
  else {
    printFloodLimit_1._3_1_ = 1;
    local_604 = 0;
    local_608 = 5;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&x_2,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&x_2,
                        (char (*) [53])"Verifying invocation sample masks do not share bits.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x_2);
    for (iStack_78c = 0; iStack_78c < height_00; iStack_78c = iStack_78c + 1) {
      for (sampleNdxA = 0; sampleNdxA < width_00; sampleNdxA = sampleNdxA + 1) {
        sampleNdxB._3_1_ = 0;
        maskA = 0;
        while( true ) {
          local_12f2 = false;
          if ((int)maskA <
              (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.m_numTargetSamples) {
            local_12f2 = (sampleNdxB._3_1_ & 1) == 0 || local_604 < 5;
          }
          dVar1 = maskA;
          if (!local_12f2) break;
          while( true ) {
            local_7b0._20_4_ = dVar1 + 1;
            local_12f4 = false;
            if ((int)local_7b0._20_4_ <
                (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                super_MultisampleRenderCase.m_numTargetSamples) {
              local_12f4 = (sampleNdxB._3_1_ & 1) == 0 || local_604 < 5;
            }
            if (!local_12f4) break;
            pvVar7 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                               ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                                local_38,(long)(int)maskA);
            tcu::TextureLevel::getAccess((PixelBufferAccess *)(local_7ec + 0x14),pvVar7);
            tcu::ConstPixelBufferAccess::getPixelUint
                      ((ConstPixelBufferAccess *)local_7b0,(int)local_7ec + 0x14,sampleNdxA,
                       iStack_78c);
            puVar9 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_7b0);
            local_7b0._16_4_ = *puVar9;
            pvVar7 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                               ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                                local_38,(long)(int)local_7b0._20_4_);
            tcu::TextureLevel::getAccess(&local_818,pvVar7);
            tcu::ConstPixelBufferAccess::getPixelUint
                      ((ConstPixelBufferAccess *)local_7ec,(int)&local_818,sampleNdxA,iStack_78c);
            puVar9 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_7ec);
            local_7ec._16_4_ = *puVar9;
            dVar1 = local_7b0._20_4_;
            if ((local_7b0._16_4_ != local_7ec._16_4_) &&
               ((local_7b0._16_4_ & local_7ec._16_4_) != 0)) {
              sampleNdxB._3_1_ = 1;
              printFloodLimit_1._3_1_ = 0;
              local_604 = local_604 + 1;
              if (local_604 < 6) {
                pTVar5 = tcu::TestContext::getLog
                                   ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                    super_MultisampleRenderCase.super_TestCase.super_TestCase.
                                    super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_998,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar8 = tcu::MessageBuilder::operator<<(&local_998,(char (*) [8])"Pixel (");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&sampleNdxA);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&stack0xfffffffffffff874);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x2a0365d);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [10])"\tSamples ");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&maskA);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [6])0x2b82e30);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)(local_7b0 + 0x14));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])" share mask bits\n")
                ;
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [6])"\tMask");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&maskA);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x2be9a12);
                tcu::Format::Hex<8UL>::Hex(&local_9a0,(ulong)(uint)local_7b0._16_4_);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_9a0);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [6])"\tMask");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)(local_7b0 + 0x14));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x2be9a12);
                tcu::Format::Hex<8UL>::Hex(&local_9a8,(ulong)(uint)local_7ec._16_4_);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_9a8);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
                tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_998);
                dVar1 = local_7b0._20_4_;
              }
            }
          }
          maskA = maskA + 1;
        }
      }
    }
    if (((printFloodLimit_1._3_1_ & 1) == 0) &&
       (sampleCoverage.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0, 5 < local_604)) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&minNumInvocations,pTVar5,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&minNumInvocations,(char (*) [5])0x2b66789);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])"Omitted ");
      iStack_b2c = local_604 + -5;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&stack0xfffffffffffff4d4);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2c3fe31);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&minNumInvocations);
    }
    iVar3 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .m_numTargetSamples;
    printCount_2 = de::max<int>(1,(iVar3 + 1) - (iVar3 + 1 >> 0x1f) >> 1);
    printFloodLimit_2._3_1_ = 1;
    local_b38 = 0;
    local_b3c = 5;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&x_3,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&x_3,
                        (char (*) [124])
                        "Verifying cardinality of separate sample mask bit sets. Expecting equal to the number of invocations, (greater or equal to "
                       );
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)&printCount_2);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a94734);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x_3);
    for (masks._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        masks._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < height_00;
        masks._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             masks._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
      for (masks._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
          (int)masks._M_t._M_impl.super__Rb_tree_header._M_node_count < width_00;
          masks._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
               (int)masks._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &mask_1);
        for (local_d10._20_4_ = 0;
            (int)local_d10._20_4_ <
            (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .m_numTargetSamples; local_d10._20_4_ = local_d10._20_4_ + 1) {
          pvVar7 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                             ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                              local_38,(long)(int)local_d10._20_4_);
          tcu::TextureLevel::getAccess(&local_d38,pvVar7);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_d10,(int)&local_d38,
                     (int)masks._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     masks._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
          puVar9 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_d10);
          local_d10._16_4_ = *puVar9;
          pVar13 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&mask_1,(value_type_conflict4 *)(local_d10 + 0x10));
          local_d48 = (_Base_ptr)pVar13.first._M_node;
          local_d40 = pVar13.second;
        }
        sVar10 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &mask_1);
        if ((int)sVar10 < printCount_2) {
          local_b38 = local_b38 + 1;
          if (local_b38 < 6) {
            pTVar5 = tcu::TestContext::getLog
                               ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                super_MultisampleRenderCase.super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_ec8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<(&local_ec8,(char (*) [8])"Pixel (");
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(int *)&masks._M_t._M_impl.super__Rb_tree_header.
                                               _M_node_count);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(int *)((long)&masks._M_t._M_impl.super__Rb_tree_header.
                                                      _M_node_count + 4));
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [31])"): Pixel invocations had only ");
            sVar10 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&mask_1);
            it._M_node._4_4_ = (undefined4)sVar10;
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&it._M_node + 4));
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [31])" separate mask sets. Expected ");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)&printCount_2);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [23])" or more. Found masks:")
            ;
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_ec8);
            local_ed8._M_node =
                 (_Base_ptr)
                 std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &mask_1);
            while( true ) {
              local_ee0._M_node =
                   (_Base_ptr)
                   std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &mask_1);
              bVar2 = std::operator!=(&local_ed8,&local_ee0);
              if (!bVar2) break;
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                  super_MultisampleRenderCase.super_TestCase.super_TestCase.
                                  super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_1060,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<(&local_1060,(char (*) [8])"\tMask: ");
              puVar11 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_ed8);
              tcu::Format::Hex<8UL>::Hex(&local_1068,(ulong)*puVar11);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1068);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1060);
              std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_ed8);
            }
          }
          printFloodLimit_2._3_1_ = 0;
        }
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &mask_1);
      }
    }
    if (((printFloodLimit_2._3_1_ & 1) == 0) &&
       (sampleCoverage.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0, 5 < local_b38)) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(&local_11e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<(&local_11e8,(char (*) [5])0x2b66789);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])"Omitted ");
      local_11ec = local_b38 + -5;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_11ec);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2c3fe31);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_11e8);
    }
  }
  if ((sampleCoverage.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
               super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Image verification failed");
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_58);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector
            ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_38);
  return;
}

Assistant:

void SampleMaskUniqueSetCase::postTest (void)
{
	DE_ASSERT((m_iterationSampleBuffers.size() % 2) == 0);
	DE_ASSERT((int)m_iterationSampleBuffers.size() / 2 == m_numTargetSamples);

	const int						width			= m_iterationSampleBuffers[0].getWidth();
	const int						height			= m_iterationSampleBuffers[0].getHeight();
	bool							allOk			= true;
	std::vector<tcu::TextureLevel>	sampleCoverage	(m_numTargetSamples);
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), "Verify", "Verify masks");

	// convert color layers to 32 bit coverage masks, 2 passes per coverage

	for (int sampleNdx = 0; sampleNdx < (int)sampleCoverage.size(); ++sampleNdx)
	{
		sampleCoverage[sampleNdx].setStorage(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT32), width, height);

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			const tcu::RGBA		lowColor	= m_iterationSampleBuffers[sampleNdx].getPixel(x, y);
			const tcu::RGBA		highColor	= m_iterationSampleBuffers[sampleNdx + (int)sampleCoverage.size()].getPixel(x, y);
			deUint16			low;
			deUint16			high;

			{
				int redBits		= (int)deFloatRound((float)lowColor.getRed() / 255.0f * 31);
				int greenBits	= (int)deFloatRound((float)lowColor.getGreen() / 255.0f * 63);
				int blueBits	= (int)deFloatRound((float)lowColor.getBlue() / 255.0f * 31);

				low = (deUint16)(redBits | (greenBits << 5) | (blueBits << 11));
			}
			{
				int redBits		= (int)deFloatRound((float)highColor.getRed() / 255.0f * 31);
				int greenBits	= (int)deFloatRound((float)highColor.getGreen() / 255.0f * 63);
				int blueBits	= (int)deFloatRound((float)highColor.getBlue() / 255.0f * 31);

				high = (deUint16)(redBits | (greenBits << 5) | (blueBits << 11));
			}

			sampleCoverage[sampleNdx].getAccess().setPixel(tcu::UVec4((((deUint32)high) << 16) | low, 0, 0, 0), x, y);
		}
	}

	// verify masks

	if (m_numRequestedSamples == 0)
	{
		// single sample target, expect mask = 0x01
		const int	printFloodLimit	= 5;
		int			printCount		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample mask is 0x00000001." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			deUint32 mask = sampleCoverage[0].getAccess().getPixelUint(x, y).x();
			if (mask != 0x01)
			{
				allOk = false;

				if (++printCount <= printFloodLimit)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Pixel (" << x << ", " << y << "): Invalid mask, got " << tcu::Format::Hex<8>(mask) << ", expected " << tcu::Format::Hex<8>(0x01) << "\n"
						<< tcu::TestLog::EndMessage;
				}
			}
		}

		if (!allOk && printCount > printFloodLimit)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "...\n"
				<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
				<< tcu::TestLog::EndMessage;
		}
	}
	else
	{
		// check uniqueness
		{
			bool		uniquenessOk	= true;
			int			printCount		= 0;
			const int	printFloodLimit	= 5;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying invocation sample masks do not share bits." << tcu::TestLog::EndMessage;

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				bool maskBitsNotUnique = false;

				for (int sampleNdxA = 0;            sampleNdxA < m_numTargetSamples && (!maskBitsNotUnique || printCount < printFloodLimit); ++sampleNdxA)
				for (int sampleNdxB = sampleNdxA+1; sampleNdxB < m_numTargetSamples && (!maskBitsNotUnique || printCount < printFloodLimit); ++sampleNdxB)
				{
					const deUint32 maskA = sampleCoverage[sampleNdxA].getAccess().getPixelUint(x, y).x();
					const deUint32 maskB = sampleCoverage[sampleNdxB].getAccess().getPixelUint(x, y).x();

					// equal mask == emitted by the same invocation
					if (maskA != maskB)
					{
						// shares samples?
						if (maskA & maskB)
						{
							maskBitsNotUnique = true;
							uniquenessOk = false;

							if (++printCount <= printFloodLimit)
							{
								m_testCtx.getLog()
									<< tcu::TestLog::Message
									<< "Pixel (" << x << ", " << y << "):\n"
									<< "\tSamples " << sampleNdxA << " and " << sampleNdxB << " share mask bits\n"
									<< "\tMask" << sampleNdxA << " = " << tcu::Format::Hex<8>(maskA) << "\n"
									<< "\tMask" << sampleNdxB << " = " << tcu::Format::Hex<8>(maskB) << "\n"
									<< tcu::TestLog::EndMessage;
							}
						}
					}
				}
			}

			if (!uniquenessOk)
			{
				allOk = false;

				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;
			}
		}

		// check number of sample mask bit groups is valid ( == number of invocations )
		{
			const deUint32			minNumInvocations	= (deUint32)de::max(1, (m_numTargetSamples+1)/2);
			bool					countOk				= true;
			int						printCount			= 0;
			const int				printFloodLimit		= 5;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying cardinality of separate sample mask bit sets. Expecting equal to the number of invocations, (greater or equal to " << minNumInvocations << ")" << tcu::TestLog::EndMessage;

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				std::set<deUint32> masks;

				for (int maskNdx = 0; maskNdx < m_numTargetSamples; ++maskNdx)
				{
					const deUint32 mask = sampleCoverage[maskNdx].getAccess().getPixelUint(x, y).x();
					masks.insert(mask);
				}

				if ((int)masks.size() < (int)minNumInvocations)
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Pixel invocations had only " << (int)masks.size() << " separate mask sets. Expected " << minNumInvocations << " or more. Found masks:"
							<< tcu::TestLog::EndMessage;

						for (std::set<deUint32>::iterator it = masks.begin(); it != masks.end(); ++it)
							m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "\tMask: " << tcu::Format::Hex<8>(*it) << "\n"
							<< tcu::TestLog::EndMessage;
					}

					countOk = false;
				}
			}

			if (!countOk)
			{
				allOk = false;

				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;
			}
		}
	}

	if (!allOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
}